

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall
Memory::HeapInfo::TransferPendingHeapBlocks(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  RecyclerSweep *recyclerSweep_local;
  HeapInfo *this_local;
  
  bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x5a0,"(!recyclerSweep.IsBackground())","!recyclerSweep.IsBackground()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  VerifySmallHeapBlockCount(this);
  bVar2 = RecyclerSweep::HasPendingEmptyBlocks(recyclerSweep);
  if (bVar2) {
    for (local_1c = 0; local_1c < 0x30; local_1c = local_1c + 1) {
      HeapBucketGroup<SmallAllocationBlockAttributes>::TransferPendingEmptyHeapBlocks
                (this->heapBuckets + local_1c,recyclerSweep);
    }
    for (local_20 = 0; local_20 < 0x1d; local_20 = local_20 + 1) {
      HeapBucketGroup<MediumAllocationBlockAttributes>::TransferPendingEmptyHeapBlocks
                (this->mediumHeapBuckets + local_20,recyclerSweep);
    }
    VerifySmallHeapBlockCount(this);
  }
  RecyclerSweep::FlushPendingTransferDisposedObjects(recyclerSweep);
  return;
}

Assistant:

void
HeapInfo::TransferPendingHeapBlocks(RecyclerSweep& recyclerSweep)
{
    Assert(!recyclerSweep.IsBackground());
    RECYCLER_SLOW_CHECK(VerifySmallHeapBlockCount());
    if (recyclerSweep.HasPendingEmptyBlocks())
    {
        for (uint i = 0; i < HeapConstants::BucketCount; i++)
        {
            heapBuckets[i].TransferPendingEmptyHeapBlocks(recyclerSweep);
        }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
        for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
        {
            mediumHeapBuckets[i].TransferPendingEmptyHeapBlocks(recyclerSweep);
        }
#endif

        RECYCLER_SLOW_CHECK(VerifySmallHeapBlockCount());
    }

    // We might still have block that has been disposed but not made allocable
    // which happens if we finish disposing object during concurrent sweep
    // and can't modify the block lists
    recyclerSweep.FlushPendingTransferDisposedObjects();
}